

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

bool __thiscall
Js::JavascriptArray::IsMissingHeadSegmentItemImpl<double>(JavascriptArray *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((this->head).ptr)->length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x32a,"(index < head->length)","index < head->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return *(undefined1 **)(&(this->head).ptr[1].left + (ulong)index * 2) == &DAT_fff80002fff80002;
}

Assistant:

bool JavascriptArray::IsMissingHeadSegmentItemImpl(const uint32 index) const
    {
        Assert(index < head->length);

        return SparseArraySegment<T>::IsMissingItem(&SparseArraySegment<T>::From(head)->elements[index]);
    }